

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void __thiscall
hiberlite::
stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>
::putNext(stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>
          *this,pair<int,_double> *el)

{
  std::
  _Rb_tree<std::pair<int,double>,std::pair<int,double>,std::_Identity<std::pair<int,double>>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>
  ::_M_insert_unique_<std::pair<int,double>const&>
            ((_Rb_tree<std::pair<int,double>,std::pair<int,double>,std::_Identity<std::pair<int,double>>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>
              *)this->ct,
             (_Base_ptr)
             ((_Rb_tree<std::pair<int,double>,std::pair<int,double>,std::_Identity<std::pair<int,double>>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>
               *)this->ct + 8),el);
  (this->it)._M_node = &(this->ct->_M_t)._M_impl.super__Rb_tree_header._M_header;
  return;
}

Assistant:

void putNext(E& el){
			ct.insert(ct.end(), el);
			it=ct.end();
		}